

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

int BIO_read(BIO *b,void *data,int len)

{
  int ret;
  int len_local;
  void *buf_local;
  BIO *bio_local;
  
  if (((b == (BIO *)0x0) || (b->method == (BIO_METHOD *)0x0)) ||
     (b->method->bread == (_func_596 *)0x0)) {
    ERR_put_error(0x11,0,0x73,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                  ,0x53);
    bio_local._4_4_ = -2;
  }
  else if (*(int *)&b->cb_arg == 0) {
    ERR_put_error(0x11,0,0x72,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                  ,0x57);
    bio_local._4_4_ = -2;
  }
  else if (len < 1) {
    bio_local._4_4_ = 0;
  }
  else {
    bio_local._4_4_ = (*b->method->bread)(b,(char *)data,len);
    if (0 < bio_local._4_4_) {
      b->next_bio = (bio_st *)((long)&b->next_bio->method + (long)bio_local._4_4_);
    }
  }
  return bio_local._4_4_;
}

Assistant:

int BIO_read(BIO *bio, void *buf, int len) {
  if (bio == NULL || bio->method == NULL || bio->method->bread == NULL) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNSUPPORTED_METHOD);
    return -2;
  }
  if (!bio->init) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNINITIALIZED);
    return -2;
  }
  if (len <= 0) {
    return 0;
  }
  int ret = bio->method->bread(bio, reinterpret_cast<char *>(buf), len);
  if (ret > 0) {
    bio->num_read += ret;
  }
  return ret;
}